

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboCases::RecreateBuffersTest::RecreateBuffersTest
          (RecreateBuffersTest *this,Context *context,FboConfig *config,deUint32 buffers,bool rebind
          )

{
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLenum GVar7;
  long *plVar8;
  long *plVar9;
  long *name;
  long local_60;
  long lStack_58;
  string local_50;
  
  FboConfig::getName_abi_cxx11_(&local_50,config);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_60 = *plVar9;
    lStack_58 = plVar8[3];
    name = &local_60;
  }
  else {
    local_60 = *plVar9;
    name = (long *)*plVar8;
  }
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,(char *)name,"Recreate buffers");
  (this->super_FboRenderCase).super_TestCase.m_context = context;
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d10e40;
  dVar4 = config->buffers;
  GVar5 = config->colorType;
  GVar6 = config->colorFormat;
  GVar7 = config->depthStencilType;
  iVar1 = config->width;
  iVar2 = config->height;
  iVar3 = config->samples;
  (this->super_FboRenderCase).m_config.depthStencilFormat = config->depthStencilFormat;
  (this->super_FboRenderCase).m_config.width = iVar1;
  (this->super_FboRenderCase).m_config.height = iVar2;
  (this->super_FboRenderCase).m_config.samples = iVar3;
  (this->super_FboRenderCase).m_config.buffers = dVar4;
  (this->super_FboRenderCase).m_config.colorType = GVar5;
  (this->super_FboRenderCase).m_config.colorFormat = GVar6;
  (this->super_FboRenderCase).m_config.depthStencilType = GVar7;
  if (name != &local_60) {
    operator_delete(name,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d10fc0;
  this->m_buffers = buffers;
  this->m_rebind = rebind;
  return;
}

Assistant:

RecreateBuffersTest::RecreateBuffersTest (Context& context, const FboConfig& config, deUint32 buffers, bool rebind)
	: FboRenderCase		(context, (string(config.getName()) + (rebind ? "" : "_no_rebind")).c_str(), "Recreate buffers", config)
	, m_buffers			(buffers)
	, m_rebind			(rebind)
{
}